

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMU_SIG_SCHEME_Unmarshal(TPMU_SIG_SCHEME *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  int iVar1;
  UINT16 UVar2;
  TPM_RC TVar3;
  
  switch(selector) {
  case 0x10:
    return 0;
  case 0x14:
  case 0x16:
  case 0x18:
  case 0x1c:
switchD_0010824f_caseD_14:
    iVar1 = *size;
    *size = iVar1 + -2;
    TVar3 = 0x9a;
    if (1 < iVar1) {
      UVar2 = ByteArrayToUint16(*buffer);
      (target->ecdaa).hashAlg = UVar2;
      *buffer = *buffer + 2;
      TVar3 = 0x83;
      if ((ushort)(UVar2 - 4) < 10) {
        TVar3 = *(TPM_RC *)(&DAT_0011d300 + (ulong)(ushort)(UVar2 - 4) * 4);
      }
    }
    break;
  case 0x1a:
    TVar3 = TPMS_SCHEME_ECDAA_Unmarshal(&target->ecdaa,buffer,size);
    return TVar3;
  default:
    if (selector == 5) goto switchD_0010824f_caseD_14;
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x15:
  case 0x17:
  case 0x19:
  case 0x1b:
    TVar3 = 0x98;
  }
  return TVar3;
}

Assistant:

TPM_RC
TPMU_SIG_SCHEME_Unmarshal(TPMU_SIG_SCHEME *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_ECDAA
        case TPM_ALG_ECDAA:
            return TPMS_SIG_SCHEME_ECDAA_Unmarshal((TPMS_SIG_SCHEME_ECDAA *)&(target->ecdaa), buffer, size);
#endif // ALG_ECDAA
#if         ALG_RSASSA
        case TPM_ALG_RSASSA:
            return TPMS_SIG_SCHEME_RSASSA_Unmarshal((TPMS_SIG_SCHEME_RSASSA *)&(target->rsassa), buffer, size);
#endif // ALG_RSASSA
#if         ALG_RSAPSS
        case TPM_ALG_RSAPSS:
            return TPMS_SIG_SCHEME_RSAPSS_Unmarshal((TPMS_SIG_SCHEME_RSAPSS *)&(target->rsapss), buffer, size);
#endif // ALG_RSAPSS
#if         ALG_ECDSA
        case TPM_ALG_ECDSA:
            return TPMS_SIG_SCHEME_ECDSA_Unmarshal((TPMS_SIG_SCHEME_ECDSA *)&(target->ecdsa), buffer, size);
#endif // ALG_ECDSA
#if         ALG_SM2
        case TPM_ALG_SM2:
            return TPMS_SIG_SCHEME_SM2_Unmarshal((TPMS_SIG_SCHEME_SM2 *)&(target->sm2), buffer, size);
#endif // ALG_SM2
#if         ALG_ECSCHNORR
        case TPM_ALG_ECSCHNORR:
            return TPMS_SIG_SCHEME_ECSCHNORR_Unmarshal((TPMS_SIG_SCHEME_ECSCHNORR *)&(target->ecschnorr), buffer, size);
#endif // ALG_ECSCHNORR
#if         ALG_HMAC
        case TPM_ALG_HMAC:
            return TPMS_SCHEME_HMAC_Unmarshal((TPMS_SCHEME_HMAC *)&(target->hmac), buffer, size);
#endif // ALG_HMAC
        case TPM_ALG_NULL:
            return TPM_RC_SUCCESS;
    }
    return TPM_RC_SELECTOR;
}